

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_1.h
# Opt level: O3

bool __thiscall
dlib::
binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
::keep_node_balanced
          (binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
           *this,node **t)

{
  char cVar1;
  node *pnVar2;
  node *pnVar3;
  node *temp;
  char cVar4;
  node *pnVar5;
  
  pnVar2 = *t;
  cVar4 = pnVar2->balance;
  if (cVar4 == '\0') {
    return false;
  }
  if (cVar4 == -2) {
    pnVar5 = pnVar2->left;
    cVar1 = pnVar5->balance;
    if ('\0' < cVar1) {
      pnVar5 = pnVar5->right;
      *t = pnVar5;
      pnVar3 = pnVar2->left;
      pnVar3->right = pnVar5->left;
      (*t)->left = pnVar3;
      pnVar2->left = (*t)->right;
      (*t)->right = pnVar2;
LAB_00234636:
      pnVar2 = *t;
      if (pnVar2->balance < '\0') {
        pnVar2->left->balance = '\0';
        cVar4 = '\x01';
      }
      else {
        if (pnVar2->balance == '\0') {
          pnVar2->left->balance = '\0';
        }
        else {
          pnVar2->left->balance = -1;
        }
        cVar4 = '\0';
      }
      pnVar2->right->balance = cVar4;
      pnVar2->balance = '\0';
      cVar4 = '\0';
      goto LAB_00234668;
    }
    cVar4 = cVar1 != -1;
    pnVar2->balance = -cVar4;
    pnVar5->balance = cVar1 != -1;
    pnVar2->left = pnVar5->right;
    pnVar5->right = *t;
  }
  else {
    if (cVar4 != '\x02') goto LAB_00234668;
    pnVar5 = pnVar2->right;
    cVar4 = pnVar5->balance;
    if (cVar4 < '\0') {
      pnVar5 = pnVar5->left;
      *t = pnVar5;
      pnVar3 = pnVar2->right;
      pnVar3->left = pnVar5->right;
      (*t)->right = pnVar3;
      pnVar2->right = (*t)->left;
      (*t)->left = pnVar2;
      goto LAB_00234636;
    }
    pnVar2->balance = cVar4 != '\x01';
    cVar4 = -(cVar4 != '\x01');
    pnVar5->balance = cVar4;
    pnVar2->right = pnVar5->left;
    pnVar5->left = *t;
  }
  *t = pnVar5;
LAB_00234668:
  return cVar4 == '\0';
}

Assistant:

bool binary_search_tree_kernel_1<domain,range,mem_manager,compare>::
    keep_node_balanced (
        node*& t
    )
    {
        // make a reference to the current node so we don't have to dereference 
        // a pointer a bunch of times
        node& tree = *t;
 
        // if tree does not need to be balanced then return false
        if (tree.balance == 0)
            return false;


        // if tree needs to be rotated left
        if (tree.balance == 2)
        {
            if (tree.right->balance >= 0)
                rotate_left(t);
            else
                double_rotate_left(t);
        }
        // else if the tree needs to be rotated right
        else if (tree.balance == -2)
        {
            if (tree.left->balance <= 0)
                rotate_right(t);
            else
                double_rotate_right(t);
        }
   

        if (t->balance == 0)
            return true;
        else
            return false; 
    }